

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::IFF_Layer2::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IFF_Layer2 *this)

{
  pointer pIVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  pointer pIVar3;
  KStringStream ss;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = std::operator<<(local_1a0,"IFF Layer 2\n");
  BeamData::GetAsString_abi_cxx11_(&local_1d0,&this->m_BmDt);
  UTILS::IndentString(&local_230,&local_1d0,Tabs,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  SecondaryOperationalData::GetAsString_abi_cxx11_(&local_210,&this->m_SOD);
  UTILS::IndentString(&local_1f0,&local_210,Tabs_00,in_CL);
  std::operator<<(poVar2,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1d0);
  pIVar1 = (this->m_vFPD).
           super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar3 = (this->m_vFPD).
                super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar3 != pIVar1; pIVar3 = pIVar3 + 1) {
    (*(pIVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_230,pIVar3);
    std::operator<<(local_1a0,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

KString IFF_Layer2::GetAsString() const
{
    KStringStream ss;

    ss << "IFF Layer 2\n"
       << IndentString( m_BmDt.GetAsString(), 1 )
       << IndentString( m_SOD.GetAsString(), 1 );

    vector<IFF_ATC_NAVAIDS_FundamentalParameterData>::const_iterator citr = m_vFPD.begin();
    vector<IFF_ATC_NAVAIDS_FundamentalParameterData>::const_iterator citrEnd = m_vFPD.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString();
    }

    return ss.str();
}